

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.hpp
# Opt level: O0

bool __thiscall OpenMD::SelectionCompiler::endOfExpressionExpected(SelectionCompiler *this)

{
  byte bVar1;
  SelectionCompiler *in_RDI;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  allocator<char> local_29;
  string local_28 [8];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  bVar1 = compileError(in_RDI,(string *)
                              CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  return (bool)(bVar1 & 1);
}

Assistant:

bool endOfExpressionExpected() {
      return compileError("end of expression expected");
    }